

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O3

QSimpleParsedNumber<long_long> qstrntoll(char *begin,qsizetype size,int base)

{
  byte *stop;
  byte bVar1;
  long lVar2;
  long lVar3;
  int __base;
  int iVar4;
  byte *pbVar5;
  long in_FS_OFFSET;
  bool bVar6;
  R_conflict1 RVar7;
  QSimpleParsedNumber<long_long> QVar8;
  __integer_from_chars_result_type<long_long> _Var9;
  unsigned_long_long check;
  longlong result;
  unsigned_long_long local_48;
  longlong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stop = (byte *)(begin + size);
  pbVar5 = (byte *)begin;
  if (size < 1) {
    bVar6 = false;
  }
  else {
    do {
      bVar1 = *pbVar5;
      if ((0x3f < bVar1) || ((1L << (bVar1 & 0x3f) & 0x100003e00U) == 0)) {
        if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
          bVar6 = bVar1 == 0x2d;
          pbVar5 = pbVar5 + 1;
          goto LAB_0011c47b;
        }
        break;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 < stop);
    bVar6 = false;
  }
LAB_0011c47b:
  RVar7 = scanPrefix((char *)pbVar5,(char *)stop,base);
  pbVar5 = (byte *)RVar7.next;
  __base = RVar7.base;
  if (pbVar5 < stop && __base != 0) {
    bVar1 = *pbVar5;
    if (0x2f < (char)bVar1) {
      iVar4 = 10;
      if (__base < 10) {
        iVar4 = __base;
      }
      if ((char)bVar1 + -0x30 < iVar4) {
LAB_0011c4e2:
        local_40 = 0;
        _Var9 = std::from_chars<long_long>((char *)pbVar5,(char *)stop,&local_40,__base);
        if ((bool)(_Var9.ec == result_out_of_range & bVar6)) {
          lVar3 = 0;
          local_48 = 0;
          std::from_chars<unsigned_long_long>((char *)pbVar5,(char *)stop,&local_48,__base);
          lVar2 = 0;
          goto LAB_0011c4a6;
        }
        if (_Var9.ec == 0) {
          lVar2 = -local_40;
          if (!bVar6) {
            lVar2 = local_40;
          }
          lVar3 = (long)_Var9.ptr - (long)begin;
          goto LAB_0011c4a6;
        }
      }
      else if (10 < __base) {
        lVar2 = 0;
        if (0x60 < (bVar1 | 0x20)) {
          lVar3 = 0;
          if (__base + 0x57U <= (uint)(bVar1 | 0x20)) goto LAB_0011c4a6;
          goto LAB_0011c4e2;
        }
      }
    }
  }
  lVar2 = 0;
  lVar3 = 0;
LAB_0011c4a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar8.used = lVar3;
    QVar8.result = lVar2;
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QSimpleParsedNumber<qlonglong> qstrntoll(const char *begin, qsizetype size, int base)
{
    const char *p = begin, *const stop = begin + size;
    while (p < stop && ascii_isspace(*p))
        ++p;
    // Frustratingly, std::from_chars() doesn't cope with a 0x prefix that might
    // be between the sign and digits, so we have to handle that for it, which
    // means we can't use its ability to read LLONG_MIN directly; see below.
    const bool negate = p < stop && *p == '-';
    if (negate || (p < stop && *p == '+'))
        ++p;

    const auto prefix = scanPrefix(p, stop, base);
    // Must check for digit, as from_chars() will accept a sign, which would be
    // a second sign, that we should reject.
    if (!prefix.base || prefix.next >= stop || !isDigitForBase(*prefix.next, prefix.base))
        return { };

    long long result = 0;
    auto res = std::from_chars(prefix.next, stop, result, prefix.base);
    if (negate && res.ec == std::errc::result_out_of_range) {
        // Maybe LLONG_MIN:
        unsigned long long check = 0;
        res = std::from_chars(prefix.next, stop, check, prefix.base);
        if (res.ec == std::errc{} && check + std::numeric_limits<long long>::min() == 0)
            return { std::numeric_limits<long long>::min(), res.ptr - begin };
        return { };
    }
    if (res.ec != std::errc{})
        return { };
    return { negate ? -result : result, res.ptr - begin };
}